

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

bool __thiscall Gluco::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  int iVar4;
  uint32_t uVar5;
  Lit *pLVar6;
  Lit *pLVar7;
  char *pcVar8;
  bool local_79;
  int local_6c;
  int j;
  Lit local_54;
  int local_50;
  Lit p_1;
  int i;
  Lit tmp;
  lbool local_3e;
  lbool local_3d;
  int local_3c;
  lbool local_35;
  int local_34;
  Clause *local_30;
  Clause *c;
  int local_20;
  uint32_t local_1c;
  int top;
  uint32_t abstract_levels_local;
  Solver *this_local;
  Lit p_local;
  
  local_1c = abstract_levels;
  _top = this;
  this_local._0_4_ = p.x;
  vec<Gluco::Lit>::clear(&this->analyze_stack,false);
  vec<Gluco::Lit>::push(&this->analyze_stack,(Lit *)&this_local);
  local_20 = vec<Gluco::Lit>::size(&this->analyze_toclear);
  do {
    iVar2 = vec<Gluco::Lit>::size(&this->analyze_stack);
    if (iVar2 < 1) {
      return true;
    }
    pLVar6 = vec<Gluco::Lit>::last(&this->analyze_stack);
    c._4_4_ = pLVar6->x;
    iVar2 = Gluco::var(c._4_4_);
    CVar3 = reason(this,iVar2);
    if (CVar3 == 0xffffffff) {
      __assert_fail("reason(var(analyze_stack.last())) != CRef_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                    ,0x2c7,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
    }
    pLVar6 = vec<Gluco::Lit>::last(&this->analyze_stack);
    local_34 = pLVar6->x;
    iVar2 = Gluco::var((Lit)local_34);
    CVar3 = reason(this,iVar2);
    local_30 = ClauseAllocator::operator[](&this->ca,CVar3);
    vec<Gluco::Lit>::pop(&this->analyze_stack);
    iVar2 = Clause::size(local_30);
    local_79 = false;
    if (iVar2 == 2) {
      pLVar6 = Clause::operator[](local_30,0);
      local_3c = pLVar6->x;
      local_35 = value(this,(Lit)local_3c);
      lbool::lbool(&local_3d,'\x01');
      local_79 = lbool::operator==(&local_35,local_3d);
    }
    if (local_79 != false) {
      pLVar6 = Clause::operator[](local_30,1);
      tmp.x = pLVar6->x;
      local_3e = value(this,tmp);
      lbool::lbool((lbool *)((long)&i + 3),'\0');
      bVar1 = lbool::operator==(&local_3e,i._3_1_);
      if (!bVar1) {
        __assert_fail("value(c[1])==l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x2ca,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
      }
      pLVar6 = Clause::operator[](local_30,0);
      p_1.x = pLVar6->x;
      pLVar6 = Clause::operator[](local_30,1);
      pLVar7 = Clause::operator[](local_30,0);
      pLVar7->x = pLVar6->x;
      pLVar6 = Clause::operator[](local_30,1);
      pLVar6->x = p_1.x;
    }
    for (local_50 = 1; iVar2 = local_50, iVar4 = Clause::size(local_30), iVar2 < iVar4;
        local_50 = local_50 + 1) {
      pLVar6 = Clause::operator[](local_30,local_50);
      local_54.x = pLVar6->x;
      iVar2 = Gluco::var(local_54);
      pcVar8 = vec<char>::operator[](&this->seen,iVar2);
      if (*pcVar8 == '\0') {
        iVar2 = Gluco::var(local_54);
        iVar2 = level(this,iVar2);
        if (0 < iVar2) {
          iVar2 = Gluco::var(local_54);
          CVar3 = reason(this,iVar2);
          if (CVar3 == 0xffffffff) {
LAB_00727fbb:
            for (local_6c = local_20; iVar2 = vec<Gluco::Lit>::size(&this->analyze_toclear),
                local_6c < iVar2; local_6c = local_6c + 1) {
              pLVar6 = vec<Gluco::Lit>::operator[](&this->analyze_toclear,local_6c);
              iVar2 = Gluco::var((Lit)pLVar6->x);
              pcVar8 = vec<char>::operator[](&this->seen,iVar2);
              *pcVar8 = '\0';
            }
            iVar2 = vec<Gluco::Lit>::size(&this->analyze_toclear);
            vec<Gluco::Lit>::shrink(&this->analyze_toclear,iVar2 - local_20);
            return false;
          }
          iVar2 = Gluco::var(local_54);
          uVar5 = abstractLevel(this,iVar2);
          if ((uVar5 & local_1c) == 0) goto LAB_00727fbb;
          iVar2 = Gluco::var(local_54);
          pcVar8 = vec<char>::operator[](&this->seen,iVar2);
          *pcVar8 = '\x01';
          vec<Gluco::Lit>::push(&this->analyze_stack,&local_54);
          vec<Gluco::Lit>::push(&this->analyze_toclear,&local_54);
        }
      }
    }
  } while( true );
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels)
{
    analyze_stack.clear(); analyze_stack.push(p);
    int top = analyze_toclear.size();
    while (analyze_stack.size() > 0){
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause& c = ca[reason(var(analyze_stack.last()))]; analyze_stack.pop();
        if(c.size()==2 && value(c[0])==l_False) {
          assert(value(c[1])==l_True);
          Lit tmp = c[0];
          c[0] =  c[1], c[1] = tmp;
        }

        for (int i = 1; i < c.size(); i++){
            Lit p  = c[i];
            if (!seen[var(p)] && level(var(p)) > 0){
                if (reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0){
                    seen[var(p)] = 1;
                    analyze_stack.push(p);
                    analyze_toclear.push(p);
                }else{
                    for (int j = top; j < analyze_toclear.size(); j++)
                        seen[var(analyze_toclear[j])] = 0;
                    analyze_toclear.shrink(analyze_toclear.size() - top);
                    return false;
                }
            }
        }
    }

    return true;
}